

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int begin_set_desired_capabilities(BEGIN_HANDLE begin,AMQP_VALUE desired_capabilities_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE desired_capabilities_amqp_value;
  BEGIN_INSTANCE *begin_instance;
  int result;
  AMQP_VALUE desired_capabilities_value_local;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance._4_4_ = 0xcf0;
  }
  else {
    if (desired_capabilities_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(desired_capabilities_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      begin_instance._4_4_ = 0xd00;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(begin->composite_value,6,local_30);
      if (iVar1 == 0) {
        begin_instance._4_4_ = 0;
      }
      else {
        begin_instance._4_4_ = 0xd06;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return begin_instance._4_4_;
}

Assistant:

int begin_set_desired_capabilities(BEGIN_HANDLE begin, AMQP_VALUE desired_capabilities_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE desired_capabilities_amqp_value;
        if (desired_capabilities_value == NULL)
        {
            desired_capabilities_amqp_value = NULL;
        }
        else
        {
            desired_capabilities_amqp_value = amqpvalue_clone(desired_capabilities_value);
        }
        if (desired_capabilities_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 6, desired_capabilities_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(desired_capabilities_amqp_value);
        }
    }

    return result;
}